

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O0

void double_conversion::FillDigits32FixedLength
               (uint32_t number,int requested_length,Vector<char> buffer,int *length)

{
  char *pcVar1;
  int in_ESI;
  uint in_EDI;
  int *in_R8;
  int i;
  int local_24;
  uint local_14;
  Vector<char> local_10;
  
  local_14 = in_EDI;
  for (local_24 = in_ESI + -1; -1 < local_24; local_24 = local_24 + -1) {
    pcVar1 = Vector<char>::operator[](&local_10,*in_R8 + local_24);
    *pcVar1 = (char)((ulong)local_14 % 10) + '0';
    local_14 = local_14 / 10;
  }
  *in_R8 = in_ESI + *in_R8;
  return;
}

Assistant:

static void FillDigits32FixedLength(uint32_t number, int requested_length,
                                    Vector<char> buffer, int* length) {
  for (int i = requested_length - 1; i >= 0; --i) {
    buffer[(*length) + i] = '0' + number % 10;
    number /= 10;
  }
  *length += requested_length;
}